

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitI31New(FunctionValidator *this,I31New *curr)

{
  bool result;
  Module *pMVar1;
  Type local_28;
  Type local_20;
  I31New *local_18;
  I31New *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (I31New *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasGC(&pMVar1->features);
  shouldBeTrue<wasm::I31New*>(this,result,local_18,"i31.new requires gc [--enable-gc]");
  local_20.id = (local_18->value->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeSubType(this,local_20,local_28,local_18->value,"i31.new\'s argument should be i32");
  return;
}

Assistant:

void FunctionValidator::visitI31New(I31New* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "i31.new requires gc [--enable-gc]");
  shouldBeSubType(curr->value->type,
                  Type::i32,
                  curr->value,
                  "i31.new's argument should be i32");
}